

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O0

Error __thiscall asmjit::CodeBuilder::embedConstPool(CodeBuilder *this,Label *label,ConstPool *pool)

{
  bool bVar1;
  Error EVar2;
  Error EVar3;
  CodeBuilder *this_00;
  ConstPool *in_RDX;
  long in_RSI;
  CodeEmitter *in_RDI;
  CBData *node;
  Error _err_1;
  Error _err;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  CodeEmitter *pCVar4;
  uint32_t size;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  EVar2 = (Error)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  if (in_RDI->_lastError == 0) {
    pCVar4 = in_RDI;
    bVar1 = CodeEmitter::isLabelValid(in_RDI,*(uint32_t *)(in_RSI + 4));
    size = (uint32_t)((ulong)pCVar4 >> 0x20);
    if (bVar1) {
      EVar3 = (*in_RDI->_vptr_CodeEmitter[10])(in_RDI,1,in_RDX->_alignment & 0xffffffff);
      EVar2 = EVar3;
      if ((EVar3 == 0) && (EVar2 = (*in_RDI->_vptr_CodeEmitter[9])(in_RDI,in_RSI), EVar2 == 0)) {
        this_00 = (CodeBuilder *)
                  newDataNode((CodeBuilder *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                              size);
        if (this_00 == (CodeBuilder *)0x0) {
          EVar2 = CodeEmitter::setLastError((CodeEmitter *)CONCAT44(EVar3,EVar2),0,(char *)in_RDI);
        }
        else {
          CBData::getData((CBData *)this_00);
          ConstPool::fill(in_RDX,(void *)CONCAT44(EVar3,EVar2));
          addNode(this_00,(CBNode *)in_RDI);
          EVar2 = 0;
        }
      }
    }
    else {
      EVar2 = CodeEmitter::setLastError
                        ((CodeEmitter *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),EVar2,
                         (char *)in_RDI);
    }
  }
  else {
    EVar2 = in_RDI->_lastError;
  }
  return EVar2;
}

Assistant:

Error CodeBuilder::embedConstPool(const Label& label, const ConstPool& pool) {
  if (_lastError) return _lastError;

  if (!isLabelValid(label))
    return setLastError(DebugUtils::errored(kErrorInvalidLabel));

  ASMJIT_PROPAGATE(align(kAlignData, static_cast<uint32_t>(pool.getAlignment())));
  ASMJIT_PROPAGATE(bind(label));

  CBData* node = newDataNode(nullptr, static_cast<uint32_t>(pool.getSize()));
  if (ASMJIT_UNLIKELY(!node))
    return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

  pool.fill(node->getData());
  addNode(node);
  return kErrorOk;
}